

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<true> * __thiscall
LabelSinglePropertyState<true>::Float
          (LabelSinglePropertyState<true> *this,Context<true> *ctx,float v)

{
  BaseState<true> *pBVar1;
  LabelObjectState<true> *in_RSI;
  undefined4 in_XMM0_Da;
  float in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  BaseState<true> *local_8;
  
  in_RSI->return_state = (BaseState<true> *)((long)&in_RSI->return_state->_vptr_BaseState + 7);
  (in_RSI->cb_label).cost = (float)((int)(in_RSI->cb_label).cost + -7);
  pBVar1 = LabelObjectState<true>::Float
                     (in_RSI,(Context<true> *)CONCAT44(in_XMM0_Da,in_stack_ffffffffffffffe0),
                      in_stack_ffffffffffffffdc);
  if (pBVar1 == (BaseState<true> *)0x0) {
    local_8 = (BaseState<true> *)0x0;
  }
  else {
    local_8 = *(BaseState<true> **)&in_RSI->found;
  }
  return local_8;
}

Assistant:

BaseState<audit>* Float(Context<audit>& ctx, float v)
  {
    // skip "_label_"
    ctx.key += 7;
    ctx.key_length -= 7;

    if (ctx.label_object_state.Float(ctx, v) == nullptr)
      return nullptr;

    return ctx.previous_state;
  }